

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O1

void __thiscall lrit::File::File(File *this,string *file)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5;
  int *piVar3;
  runtime_error *prVar4;
  char **in_R9;
  ifstream ifs;
  char local_294 [4];
  undefined1 local_290 [32];
  _Base_ptr p_Stack_270;
  size_t local_268;
  string local_260;
  char *local_240;
  long local_238 [4];
  byte abStack_218 [488];
  
  (this->file_)._M_dataplus._M_p = (pointer)&(this->file_).field_2;
  pcVar2 = (file->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar2,pcVar2 + file->_M_string_length);
  this_00 = &this->header_;
  p_Var1 = &(this->m_)._M_t._M_impl.super__Rb_tree_header;
  (this->m_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->header_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->header_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->header_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::ifstream::ifstream(local_238,(this->file_)._M_dataplus._M_p,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    args_5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x10);
    local_294[0] = 'i';
    local_294[1] = '\0';
    local_294[2] = '\0';
    local_294[3] = '\0';
    piVar3 = __errno_location();
    local_240 = strerror(*piVar3);
    util::str<char[16],std::__cxx11::string,char[3],char*>
              (&local_260,(util *)"Unable to open ",(char (*) [16])this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)": ",
               (char (*) [3])&local_240,in_R9);
    util::str<char[27],char[90],char[2],int,char[3],std::__cxx11::string>
              ((string *)local_290,(util *)"Assertion `ifs` failed at ",
               (char (*) [27])
               "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/src/lrit/file.cc"
               ,(char (*) [90])":",(char (*) [2])local_294,(int *)", ",(char (*) [3])&local_260,
               args_5);
    std::runtime_error::runtime_error((runtime_error *)args_5,(string *)local_290);
    __cxa_throw(args_5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,0x10);
  std::istream::read((char *)local_238,
                     (long)(this->header_).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    getHeader<lrit::PrimaryHeader>((PrimaryHeader *)local_290,this_00,0);
    (this->ph_).dataLength = local_290._16_8_;
    (this->ph_).headerType = local_290[0];
    (this->ph_).field_0x1 = local_290[1];
    (this->ph_).headerLength = local_290._2_2_;
    (this->ph_).fileType = local_290[4];
    *(undefined3 *)&(this->ph_).field_0x5 = local_290._5_3_;
    *(ulong *)&(this->ph_).totalHeaderLength = CONCAT44(local_290._12_4_,local_290._8_4_);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (this_00,(ulong)(this->ph_).totalHeaderLength);
    std::istream::read((char *)local_238,
                       (long)((this->header_).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + 0x10));
    if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
      getHeaderMap((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                   local_290,this_00);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::clear(&(this->m_)._M_t);
      if ((_Base_ptr)local_290._16_8_ != (_Base_ptr)0x0) {
        (this->m_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = local_290._8_4_;
        (this->m_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)local_290._16_8_;
        (this->m_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)local_290._24_8_;
        (this->m_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = p_Stack_270;
        *(_Rb_tree_header **)(local_290._16_8_ + 8) = p_Var1;
        (this->m_)._M_t._M_impl.super__Rb_tree_header._M_node_count = local_268;
        local_290._16_8_ = (_Base_ptr)0x0;
        local_268 = 0;
        local_290._24_8_ = (_Base_ptr)(local_290 + 8);
        p_Stack_270 = (_Base_ptr)(local_290 + 8);
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                   *)local_290);
      std::ifstream::~ifstream(local_238);
      return;
    }
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_260._M_dataplus._M_p._0_4_ = 0x76;
    util::str<char[27],char[90],char[2],int>
              ((string *)local_290,(util *)"Assertion `ifs` failed at ",
               (char (*) [27])
               "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/src/lrit/file.cc"
               ,(char (*) [90])":",(char (*) [2])&local_260,(int *)in_R9);
    std::runtime_error::runtime_error(prVar4,(string *)local_290);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_260._M_dataplus._M_p._0_4_ = 0x6e;
  util::str<char[27],char[90],char[2],int>
            ((string *)local_290,(util *)"Assertion `ifs` failed at ",
             (char (*) [27])
             "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/src/lrit/file.cc"
             ,(char (*) [90])":",(char (*) [2])&local_260,(int *)in_R9);
  std::runtime_error::runtime_error(prVar4,(string *)local_290);
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

File::File(const std::string& file)
  : file_(file) {
  std::ifstream ifs(file_.c_str());
  ASSERTM(ifs, "Unable to open ", file_, ": ", strerror(errno));

  // First 16 bytes hold the primary header
  header_.resize(16);
  ifs.read(reinterpret_cast<char*>(&header_[0]), header_.size());
  ASSERT(ifs);

  // Parse primary header
  ph_ = lrit::getHeader<lrit::PrimaryHeader>(header_, 0);

  // Read remaining headers
  header_.resize(ph_.totalHeaderLength);
  ifs.read(reinterpret_cast<char*>(&header_[16]), ph_.totalHeaderLength - 16);
  ASSERT(ifs);

  // Build header map
  m_ = lrit::getHeaderMap(header_);
}